

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase170::run(TestCase170 *this)

{
  bool bVar1;
  AsyncIoProvider *pAVar2;
  AsyncIoStream *pAVar3;
  bool local_15a;
  bool local_159;
  undefined1 local_158 [6];
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  String result2;
  undefined1 *local_138 [2];
  undefined1 *local_128;
  undefined1 *local_120;
  Type local_118;
  Promise<void> local_108;
  Promise<unsigned_long> local_f8;
  undefined1 local_e8 [8];
  String result;
  undefined1 *local_c8 [2];
  undefined1 *local_b8;
  undefined1 *local_b0;
  Type local_a8;
  Promise<void> local_98;
  undefined1 local_88 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:179:11),_unsigned_long>
  promise;
  undefined1 local_70 [4];
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  undefined1 local_60 [8];
  TwoWayPipe pipe;
  AsyncIoContext ioContext;
  TestCase170 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar2 = Own<kj::AsyncIoProvider>::operator->
                     ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  (*pAVar2->_vptr_AsyncIoProvider[1])(local_60);
  pAVar3 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)local_60);
  (**(pAVar3->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_a8,&pAVar3->super_AsyncOutputStream,"foo",3);
  local_b8 = local_60;
  local_b0 = local_70;
  Promise<void>::then<kj::(anonymous_namespace)::TestCase170::run()::__0,kj::_::PropagateException>
            (&local_98,&local_a8,(PropagateException *)&local_b8);
  local_c8[0] = local_70;
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::TestCase170::run()::__1,kj::_::PropagateException>
            ((Promise<unsigned_long> *)local_88,(Type *)&local_98,(PropagateException *)local_c8);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_98);
  Promise<void>::~Promise((Promise<void> *)&local_a8);
  pAVar3 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipe.ends[0].ptr);
  (**(pAVar3->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_118,&pAVar3->super_AsyncOutputStream,"bar",3);
  local_128 = local_60;
  local_120 = (undefined1 *)((long)&promise.super_PromiseBase.node.ptr + 4);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase170::run()::__2,kj::_::PropagateException>
            (&local_108,&local_118,(PropagateException *)&local_128);
  local_138[0] = (undefined1 *)((long)&promise.super_PromiseBase.node.ptr + 4);
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::TestCase170::run()::__3,kj::_::PropagateException>
            (&local_f8,(Type *)&local_108,(PropagateException *)local_138);
  Promise<kj::String>::wait((Promise<kj::String> *)local_e8,&local_f8);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_f8);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_108);
  Promise<void>::~Promise((Promise<void> *)&local_118);
  Promise<kj::String>::wait((Promise<kj::String> *)local_158,local_88);
  bVar1 = kj::operator==("foo",(String *)local_e8);
  if (!bVar1) {
    local_159 = _::Debug::shouldLog(ERROR);
    while (local_159 != false) {
      _::Debug::log<char_const(&)[37],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0xc1,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (result)\", \"foo\", result",
                 (char (*) [37])"failed: expected (\"foo\") == (result)",(char (*) [4])0x654402,
                 (String *)local_e8);
      local_159 = false;
    }
  }
  bVar1 = kj::operator==("bar",(String *)local_158);
  if (!bVar1) {
    local_15a = _::Debug::shouldLog(ERROR);
    while (local_15a != false) {
      _::Debug::log<char_const(&)[38],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0xc2,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (result2)\", \"bar\", result2",
                 (char (*) [38])"failed: expected (\"bar\") == (result2)",(char (*) [4])0x635ef5,
                 (String *)local_158);
      local_15a = false;
    }
  }
  String::~String((String *)local_158);
  String::~String((String *)local_e8);
  Promise<kj::String>::~Promise((Promise<kj::String> *)local_88);
  TwoWayPipe::~TwoWayPipe((TwoWayPipe *)local_60);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&pipe.ends[1].ptr);
  return;
}

Assistant:

TEST(AsyncIo, TwoWayPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newTwoWayPipe();
  char receiveBuffer1[4];
  char receiveBuffer2[4];

  auto promise = pipe.ends[0]->write("foo", 3).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  kj::String result = pipe.ends[1]->write("bar", 3).then([&]() {
    return pipe.ends[1]->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
  EXPECT_EQ("bar", result2);
}